

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O2

uint fl_old_shortcut(char *s)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar3 = 0;
  if (s != (char *)0x0) {
    cVar1 = *s;
    uVar3 = 0;
    if (cVar1 != '\0') {
      if ((s[1] == '\0') && ((cVar1 == '!' || (cVar1 == '@')))) {
        return (int)cVar1;
      }
      bVar10 = cVar1 == '#';
      pcVar4 = s + 1;
      if (!bVar10) {
        pcVar4 = s;
      }
      uVar8 = (ulong)(s[bVar10] == '+');
      uVar3 = (uint)bVar10 * 0x80000 + 0x10000;
      if (s[bVar10] != '+') {
        uVar3 = (uint)bVar10 * 0x80000;
      }
      uVar6 = uVar3 | 0x40000;
      if (pcVar4[uVar8] != '^') {
        uVar6 = uVar3;
      }
      uVar7 = (ulong)(pcVar4[uVar8] == '^');
      lVar5 = uVar7 + uVar8;
      uVar9 = (ulong)(pcVar4[uVar7 + uVar8] == '!');
      uVar3 = uVar6 | 0x400000;
      if (pcVar4[uVar7 + uVar8] != '!') {
        uVar3 = uVar6;
      }
      lVar2 = uVar9 + lVar5;
      bVar10 = pcVar4[uVar9 + lVar5] == '@';
      uVar6 = uVar3 | 0x40000;
      if (!bVar10) {
        uVar6 = uVar3;
      }
      uVar3 = (uint)pcVar4[(ulong)bVar10 + lVar2];
      if ((uVar3 != 0) && ((pcVar4 + (ulong)bVar10 + lVar2)[1] != '\0')) {
        lVar5 = strtol(pcVar4 + (ulong)bVar10 + lVar2,(char **)0x0,0);
        uVar3 = (uint)lVar5;
      }
      uVar3 = uVar3 | uVar6;
    }
  }
  return uVar3;
}

Assistant:

unsigned int fl_old_shortcut(const char* s) {
  if (!s || !*s) return 0;
  if (s[1]==0 && strchr("@!",s[0])) return s[0]; // maintain legacy behavior for "!" and "@"
  unsigned int n = 0;
  if (*s == '#') {n |= FL_ALT; s++;}
  if (*s == '+') {n |= FL_SHIFT; s++;}
  if (*s == '^') {n |= FL_CTRL; s++;}
  if (*s == '!') {n |= FL_META; s++;} 	 // added in 1.3.3
  if (*s == '@') {n |= FL_COMMAND; s++;} // added in 1.3.3
  if (*s && s[1]) return n | (int)strtol(s,0,0); // allow 0xf00 to get any key
  return n | *s;
}